

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O3

Vec_Ptr_t *
Llb_ImgSupports(Aig_Man_t *p,Vec_Ptr_t *vDdMans,Vec_Int_t *vStart,Vec_Int_t *vStop,int fAddPis,
               int fVerbose)

{
  size_t __size;
  int iVar1;
  int iVar2;
  DdHalfWord DVar3;
  int *piVar4;
  DdManager *dd;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  int *piVar8;
  long lVar9;
  void *pvVar10;
  DdNode *n;
  DdNode *pDVar11;
  Vec_Ptr_t *pVVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  char *__format;
  long lVar20;
  DdNode *pDVar21;
  
  if (vDdMans->nSize < 1) {
LAB_0082f42f:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  iVar5 = Cudd_ReadSize((DdManager *)*vDdMans->pArray);
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  piVar8 = (int *)malloc(0x10);
  iVar19 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar19 = iVar5;
  }
  *piVar8 = iVar19;
  lVar15 = (long)iVar19;
  lVar9 = (long)iVar5;
  if (iVar19 == 0) {
    piVar8[2] = 0;
    piVar8[3] = 0;
    piVar8[1] = iVar5;
  }
  else {
    pvVar10 = malloc(lVar15 * 4);
    *(void **)(piVar8 + 2) = pvVar10;
    piVar8[1] = iVar5;
    if (pvVar10 != (void *)0x0) {
      memset(pvVar10,0,lVar9 * 4);
      goto LAB_0082ef0e;
    }
  }
  pvVar10 = (void *)0x0;
LAB_0082ef0e:
  iVar1 = vStart->nSize;
  if (0 < (long)iVar1) {
    piVar4 = vStart->pArray;
    uVar16 = 0;
    do {
      iVar2 = piVar4[uVar16];
      if (((long)iVar2 < 0) || (piVar8[1] <= iVar2)) goto LAB_0082f3f1;
      *(undefined4 *)((long)pvVar10 + (long)iVar2 * 4) = 1;
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)(long)iVar1);
  }
  pVVar6->nSize = 1;
  *ppvVar7 = piVar8;
  if (vDdMans->nSize < 1) {
    uVar14 = 1;
    uVar13 = 100;
  }
  else {
    uVar16 = 100;
    lVar20 = 0;
    uVar18 = 1;
    do {
      dd = (DdManager *)vDdMans->pArray[lVar20];
      piVar8 = (int *)malloc(0x10);
      *piVar8 = iVar19;
      if (iVar19 == 0) {
        piVar8[2] = 0;
        piVar8[3] = 0;
        piVar8[1] = iVar5;
      }
      else {
        pvVar10 = malloc(lVar15 * 4);
        *(void **)(piVar8 + 2) = pvVar10;
        piVar8[1] = iVar5;
        if (pvVar10 != (void *)0x0) {
          memset(pvVar10,0,lVar9 * 4);
        }
      }
      n = Cudd_Support(dd,dd->bFunc);
      Cudd_Ref(n);
      pDVar11 = Cudd_ReadOne(dd);
      pDVar21 = n;
      if (n != pDVar11) {
        do {
          DVar3 = pDVar21->index;
          if (((long)(int)DVar3 < 0) || (piVar8[1] <= (int)DVar3)) goto LAB_0082f3f1;
          *(undefined4 *)(*(long *)(piVar8 + 2) + (long)(int)DVar3 * 4) = 1;
          pDVar21 = (pDVar21->type).kids.T;
          pDVar11 = Cudd_ReadOne(dd);
        } while (pDVar21 != pDVar11);
      }
      Cudd_RecursiveDeref(dd,n);
      uVar14 = (uint)uVar16;
      if (uVar18 == uVar14) {
        if ((int)uVar14 < 0x10) {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
          }
          pVVar6->pArray = ppvVar7;
          pVVar6->nCap = 0x10;
          uVar16 = 0x10;
        }
        else {
          uVar16 = (ulong)(uVar14 * 2);
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(uVar16 * 8);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar6->pArray,uVar16 * 8);
          }
          pVVar6->pArray = ppvVar7;
          pVVar6->nCap = uVar14 * 2;
        }
      }
      else {
        ppvVar7 = pVVar6->pArray;
      }
      uVar13 = (uint)uVar16;
      uVar14 = uVar18 + 1;
      pVVar6->nSize = uVar14;
      ppvVar7[uVar18] = piVar8;
      lVar20 = lVar20 + 1;
      uVar18 = uVar14;
    } while (lVar20 < vDdMans->nSize);
  }
  piVar8 = (int *)malloc(0x10);
  *piVar8 = iVar19;
  if (iVar19 == 0) {
    piVar8[2] = 0;
    piVar8[3] = 0;
    piVar8[1] = iVar5;
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = malloc(lVar15 << 2);
    *(void **)(piVar8 + 2) = pvVar10;
    piVar8[1] = iVar5;
    if (pvVar10 == (void *)0x0) {
      pvVar10 = (void *)0x0;
    }
    else {
      memset(pvVar10,0,lVar9 << 2);
    }
  }
  iVar19 = vStop->nSize;
  if (0 < (long)iVar19) {
    piVar4 = vStop->pArray;
    uVar16 = 0;
    do {
      iVar1 = piVar4[uVar16];
      if (((long)iVar1 < 0) || (piVar8[1] <= iVar1)) goto LAB_0082f3f1;
      *(undefined4 *)((long)pvVar10 + (long)iVar1 * 4) = 1;
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)(long)iVar19);
  }
  if ((fAddPis != 0) && (iVar19 = p->nTruePis, 0 < (long)iVar19)) {
    pVVar12 = p->vCis;
    uVar16 = 0;
    do {
      if ((long)pVVar12->nSize <= (long)uVar16) goto LAB_0082f42f;
      iVar1 = *(int *)((long)pVVar12->pArray[uVar16] + 0x24);
      if (((long)iVar1 < 0) || (piVar8[1] <= iVar1)) {
LAB_0082f3f1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)((long)pvVar10 + (long)iVar1 * 4) = 1;
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)(long)iVar19);
  }
  if (uVar14 == uVar13) {
    if ((int)uVar13 < 0x10) {
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
      }
      pVVar6->pArray = ppvVar7;
      pVVar6->nCap = 0x10;
    }
    else {
      __size = (ulong)(uVar13 * 2) * 8;
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(__size);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar6->pArray,__size);
      }
      pVVar6->pArray = ppvVar7;
      pVVar6->nCap = uVar13 * 2;
    }
  }
  else {
    ppvVar7 = pVVar6->pArray;
  }
  uVar13 = uVar14 + 1;
  pVVar6->nSize = uVar13;
  ppvVar7[(int)uVar14] = piVar8;
  pVVar12 = p->vObjs;
  if (iVar5 != pVVar12->nSize) {
    __assert_fail("nSize == Aig_ManObjNumMax(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Image.c"
                  ,0x53,
                  "Vec_Ptr_t *Llb_ImgSupports(Aig_Man_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, int, int)"
                 );
  }
  if (0 < iVar5 && fVerbose != 0) {
    uVar16 = 0;
    do {
      piVar8 = (int *)pVVar12->pArray[uVar16];
      if (piVar8 != (int *)0x0) {
        uVar17 = 0;
        iVar19 = 0;
        do {
          if ((long)*(int *)((long)pVVar6->pArray[uVar17] + 4) <= (long)uVar16) goto LAB_0082f410;
          iVar19 = iVar19 + *(int *)(*(long *)((long)pVVar6->pArray[uVar17] + 8) + uVar16 * 4);
          uVar17 = uVar17 + 1;
        } while (uVar13 != uVar17);
        if (iVar19 != 0) {
          printf("Obj = %4d : ",uVar16 & 0xffffffff);
          uVar14 = (uint)*(undefined8 *)(piVar8 + 6) & 7;
          if (uVar14 == 3) {
            __format = "li  ";
            if (*piVar8 < p->nTruePos) goto LAB_0082f36e;
LAB_0082f380:
            printf(__format);
          }
          else {
            if (uVar14 == 2) {
              __format = "lo  ";
              if (*piVar8 < p->nTruePis) {
                __format = "pi  ";
              }
              goto LAB_0082f380;
            }
LAB_0082f36e:
            __format = "and ";
            if (0xfffffffd < ((uint)*(undefined8 *)(piVar8 + 6) & 7) - 7) goto LAB_0082f380;
          }
          ppvVar7 = pVVar6->pArray;
          uVar17 = 0;
          do {
            if ((long)*(int *)((long)ppvVar7[uVar17] + 4) <= (long)uVar16) {
LAB_0082f410:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            printf("%d");
            uVar17 = uVar17 + 1;
          } while (uVar13 != uVar17);
          putchar(10);
          pVVar12 = p->vObjs;
        }
      }
      uVar16 = uVar16 + 1;
    } while ((long)uVar16 < (long)pVVar12->nSize);
  }
  return pVVar6;
}

Assistant:

Vec_Ptr_t * Llb_ImgSupports( Aig_Man_t * p, Vec_Ptr_t * vDdMans, Vec_Int_t * vStart, Vec_Int_t * vStop, int fAddPis, int fVerbose )
{
    Vec_Ptr_t * vSupps;
    Vec_Int_t * vOne;
    Aig_Obj_t * pObj;
    DdManager * dd;
    DdNode * bSupp, * bTemp;
    int i, Entry, nSize;
    nSize  = Cudd_ReadSize( (DdManager *)Vec_PtrEntry( vDdMans, 0 ) );
    vSupps = Vec_PtrAlloc( 100 );
    // create initial
    vOne = Vec_IntStart( nSize );
    Vec_IntForEachEntry( vStart, Entry, i )
        Vec_IntWriteEntry( vOne, Entry, 1 );
    Vec_PtrPush( vSupps, vOne );
    // create intermediate 
    Vec_PtrForEachEntry( DdManager *, vDdMans, dd, i )
    {
        vOne  = Vec_IntStart( nSize );
        bSupp = Cudd_Support( dd, dd->bFunc );  Cudd_Ref( bSupp );
        for ( bTemp = bSupp; bTemp != Cudd_ReadOne(dd); bTemp = cuddT(bTemp) )
            Vec_IntWriteEntry( vOne, bTemp->index, 1 );
        Cudd_RecursiveDeref( dd, bSupp );
        Vec_PtrPush( vSupps, vOne );
    }
    // create final
    vOne = Vec_IntStart( nSize );
    Vec_IntForEachEntry( vStop, Entry, i )
        Vec_IntWriteEntry( vOne, Entry, 1 );
    if ( fAddPis )
        Saig_ManForEachPi( p, pObj, i )
            Vec_IntWriteEntry( vOne, Aig_ObjId(pObj), 1 );
    Vec_PtrPush( vSupps, vOne );

    // print supports
    assert( nSize == Aig_ManObjNumMax(p) );
    if ( !fVerbose )
        return vSupps;
    Aig_ManForEachObj( p, pObj, i )
    {
        int k, Counter = 0;
        Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
            Counter += Vec_IntEntry(vOne, i);
        if ( Counter == 0 ) 
            continue;
        printf( "Obj = %4d : ", i );
        if ( Saig_ObjIsPi(p,pObj) )
            printf( "pi  " );
        else if ( Saig_ObjIsLo(p,pObj) )
            printf( "lo  " );
        else if ( Saig_ObjIsLi(p,pObj) )
            printf( "li  " );
        else if ( Aig_ObjIsNode(pObj) )
            printf( "and " );
        Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
            printf( "%d", Vec_IntEntry(vOne, i) );
        printf( "\n" );
    }
    return vSupps;
}